

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O2

void __thiscall trun::ResultsReportJSON::PrintAssertError(ResultsReportJSON *this,Ref *result)

{
  AssertErrorItem *aerr;
  element_type *peVar1;
  long lVar2;
  long lVar3;
  __shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  aerr = (((result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
         assertError).assertErrors.
         super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
         ._M_impl.super__Vector_impl_data._M_start;
  ResultsReportPinterBase::WriteLine
            (&this->super_ResultsReportPinterBase,"\"IsAssertValid\" : true,");
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Assert\" : {");
  PrintAssert(this,aerr);
  peVar1 = (result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  lVar2 = (long)*(pointer *)
                 ((long)&(peVar1->assertError).assertErrors.
                         super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                         ._M_impl.super__Vector_impl_data + 8) -
          (long)(peVar1->assertError).assertErrors.
                super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = lVar2 % 0x48;
  if (1 < (ulong)(lVar2 / 0x48)) {
    ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"},",lVar3);
    std::__shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_28,&result->super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>)
    ;
    PrintAssertArray(this,(Ref *)&_Stack_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
    return;
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"}",lVar3);
  return;
}

Assistant:

void ResultsReportJSON::PrintAssertError(const TestResult::Ref result) {
    auto &aerr = result->AssertError().Errors().front();

    WriteLine(R"("IsAssertValid" : true,)");
    // Up to v2.0.0 we only had this
    WriteLine(R"("Assert" : {)");
    PrintAssert(aerr);
    // This array is new from v2.1.0
    if (result->AssertError().NumErrors() > 1) {
        WriteLine("},");
        // NOTE: this is assumed to be last item in the parent object...
        PrintAssertArray(result);
    } else {
        WriteLine("}");
    }
}